

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O2

void __thiscall
QStyledItemDelegate::initStyleOption
          (QStyledItemDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  undefined4 uVar1;
  uint uVar2;
  PrivateShared *pPVar3;
  undefined1 *puVar4;
  quintptr qVar5;
  char16_t *pcVar6;
  char cVar7;
  bool bVar8;
  QFlags<Qt::AlignmentFlag> QVar9;
  CheckState CVar10;
  int iVar11;
  QVariant *pQVar12;
  QSize QVar13;
  ulong uVar14;
  ulong uVar15;
  State SVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  QModelRoleDataSpan roleDataSpan;
  QColor QVar18;
  QIcon QStack_88;
  QModelRoleDataSpan local_80;
  QSizeF local_70;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (option->index).m.ptr = (index->m).ptr;
  iVar11 = index->c;
  qVar5 = index->i;
  (option->index).r = index->r;
  (option->index).c = iVar11;
  (option->index).i = qVar5;
  roleDataSpan.m_modelRoleData = (QModelRoleData *)(*(long *)(this + 8) + 0x80);
  local_80.m_len = 7;
  roleDataSpan.m_len = 7;
  local_80.m_modelRoleData = roleDataSpan.m_modelRoleData;
  QModelIndex::multiData(index,roleDataSpan);
  pQVar12 = QModelRoleDataSpan::dataForRole(&local_80,6);
  if ((3 < *(ulong *)&(pQVar12->d).field_0x18) && (cVar7 = ::QVariant::isNull(), cVar7 == '\0')) {
    qvariant_cast<QFont>((QVariant *)&local_70);
    QFont::resolve((QFont *)local_58.data);
    pPVar3 = *(PrivateShared **)&option->font;
    *(PrivateShared **)&option->font = local_58.shared;
    uVar1 = *(undefined4 *)&option->field_0x60;
    *(undefined4 *)&option->field_0x60 = local_58._8_4_;
    local_58._8_4_ = uVar1;
    local_58.shared = pPVar3;
    QFont::~QFont((QFont *)local_58.data);
    QFont::~QFont((QFont *)&local_70);
    QFontMetrics::QFontMetrics((QFontMetrics *)local_58.data,&option->font);
    pPVar3 = *(PrivateShared **)&(option->super_QStyleOption).fontMetrics;
    *(PrivateShared **)&(option->super_QStyleOption).fontMetrics = local_58.shared;
    local_58.shared = pPVar3;
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_58.data);
  }
  pQVar12 = QModelRoleDataSpan::dataForRole(&local_80,7);
  if ((3 < *(ulong *)&(pQVar12->d).field_0x18) && (cVar7 = ::QVariant::isNull(), cVar7 == '\0')) {
    QVar9 = QtPrivate::legacyFlagValueFromModelData<QFlags<Qt::AlignmentFlag>>(pQVar12);
    (option->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (Int)QVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
              super_QFlagsStorage<Qt::AlignmentFlag>.i;
  }
  pQVar12 = QModelRoleDataSpan::dataForRole(&local_80,9);
  bVar8 = ::QVariant::canConvert<QBrush>(pQVar12);
  if (bVar8) {
    qvariant_cast<QBrush>((QVariant *)&local_58);
    QPalette::setBrush(&(option->super_QStyleOption).palette,Text,(QBrush *)local_58.data);
    QBrush::~QBrush((QBrush *)local_58.data);
  }
  pQVar12 = QModelRoleDataSpan::dataForRole(&local_80,10);
  if ((3 < *(ulong *)&(pQVar12->d).field_0x18) && (cVar7 = ::QVariant::isNull(), cVar7 == '\0')) {
    *(byte *)&(option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>
              .super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
         (byte)(option->features).
               super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
               super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i | 4;
    CVar10 = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(pQVar12);
    option->checkState = CVar10;
  }
  pQVar12 = QModelRoleDataSpan::dataForRole(&local_80,1);
  if ((*(ulong *)&(pQVar12->d).field_0x18 < 4) || (cVar7 = ::QVariant::isNull(), cVar7 != '\0'))
  goto switchD_00508158_caseD_1002;
  *(byte *)&(option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
            super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
       (byte)(option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
             super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i | 0x10;
  iVar11 = ::QVariant::typeId(pQVar12);
  switch(iVar11) {
  case 0x1001:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    qvariant_cast<QPixmap>((QVariant *)&local_58);
    QIcon::QIcon((QIcon *)&local_70,(QPixmap *)local_58.data);
    QIcon::operator=(&option->icon,(QIcon *)&local_70);
    QIcon::~QIcon((QIcon *)&local_70);
    local_70.wd = (qreal)QPixmap::deviceIndependentSize();
    local_70.ht = (qreal)CONCAT44(in_XMM1_Db,in_XMM1_Da);
    QVar13 = QSizeF::toSize(&local_70);
    option->decorationSize = QVar13;
    goto LAB_0050828c;
  case 0x1003:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)local_58.data,&option->decorationSize);
    QVar18 = qvariant_cast<QColor>(pQVar12);
    local_70.wd = QVar18._0_8_;
    local_70.ht._0_6_ = QVar18.ct._4_6_;
    QPixmap::fill((QColor *)local_58.data);
    QIcon::QIcon((QIcon *)&local_70,(QPixmap *)local_58.data);
    QIcon::operator=(&option->icon,(QIcon *)&local_70);
    QIcon::~QIcon((QIcon *)&local_70);
LAB_0050828c:
    QPixmap::~QPixmap((QPixmap *)local_58.data);
    break;
  case 0x1005:
    qvariant_cast<QIcon>((QVariant *)&local_58);
    QIcon::operator=(&option->icon,(QIcon *)&local_58.shared);
    QIcon::~QIcon((QIcon *)&local_58.shared);
    cVar7 = QIcon::isNull();
    if (cVar7 == '\0') {
      uVar2 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i;
      SVar16 = (uint)(int)(short)uVar2 >> 0xf & 3;
      if ((uVar2 & 1) == 0) {
        SVar16 = Off;
      }
      uVar14 = QIcon::actualSize((QSize *)&option->icon,(int)option + 0x50,SVar16);
      uVar15 = uVar14 >> 0x20;
      uVar2 = (option->decorationSize).wd.m_i;
      uVar17 = (ulong)uVar2;
      if ((int)uVar14 <= (int)uVar2) {
        uVar17 = uVar14 & 0xffffffff;
      }
      uVar2 = (option->decorationSize).ht.m_i;
      if ((int)uVar2 < (int)(uVar14 >> 0x20)) {
        uVar15 = (ulong)uVar2;
      }
      option->decorationSize = (QSize)(uVar17 | uVar15 << 0x20);
    }
    else {
      *(byte *)&(option->features).
                super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
           (byte)(option->features).
                 super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                 super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 0xef;
    }
    break;
  case 0x1006:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    qvariant_cast<QImage>((QVariant *)&local_58);
    QPixmap::fromImage(&local_70,&local_58,0);
    QIcon::QIcon(&QStack_88,(QPixmap *)&local_70);
    QIcon::operator=(&option->icon,&QStack_88);
    QIcon::~QIcon(&QStack_88);
    QPixmap::~QPixmap((QPixmap *)&local_70);
    local_70.wd = (qreal)QImage::deviceIndependentSize();
    local_70.ht = (qreal)CONCAT44(in_XMM1_Db,in_XMM1_Da);
    QVar13 = QSizeF::toSize(&local_70);
    option->decorationSize = QVar13;
    QImage::~QImage((QImage *)local_58.data);
  }
switchD_00508158_caseD_1002:
  pQVar12 = QModelRoleDataSpan::dataForRole(&local_80,0);
  if ((3 < *(ulong *)&(pQVar12->d).field_0x18) && (cVar7 = ::QVariant::isNull(), cVar7 == '\0')) {
    *(byte *)&(option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>
              .super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
         (byte)(option->features).
               super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
               super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i | 8;
    (**(code **)(*(long *)this + 0xb0))(&local_58,this,pQVar12,&option->locale);
    pPVar3 = (PrivateShared *)(option->text).d.d;
    pcVar6 = (option->text).d.ptr;
    (option->text).d.d = (Data *)local_58.shared;
    (option->text).d.ptr = (char16_t *)local_58._8_8_;
    puVar4 = (undefined1 *)(option->text).d.size;
    (option->text).d.size = local_58._16_8_;
    local_58.shared = pPVar3;
    local_58._8_8_ = pcVar6;
    local_58._16_8_ = puVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  }
  QModelRoleDataSpan::dataForRole(&local_80,8);
  qvariant_cast<QBrush>((QVariant *)&local_58);
  pPVar3 = *(PrivateShared **)&option->backgroundBrush;
  *(PrivateShared **)&option->backgroundBrush = local_58.shared;
  local_58.shared = pPVar3;
  QBrush::~QBrush((QBrush *)local_58.data);
  (option->super_QStyleOption).styleObject = (QObject *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyledItemDelegate::initStyleOption(QStyleOptionViewItem *option,
                                         const QModelIndex &index) const
{
    option->index = index;

    Q_D(const QStyledItemDelegate);
    QModelRoleDataSpan modelRoleDataSpan = d->modelRoleData;
    index.multiData(modelRoleDataSpan);

    const QVariant *value;
    value = modelRoleDataSpan.dataForRole(Qt::FontRole);
    if (value->isValid() && !value->isNull()) {
        option->font = qvariant_cast<QFont>(*value).resolve(option->font);
        option->fontMetrics = QFontMetrics(option->font);
    }

    value = modelRoleDataSpan.dataForRole(Qt::TextAlignmentRole);
    if (value->isValid() && !value->isNull())
        option->displayAlignment = QtPrivate::legacyFlagValueFromModelData<Qt::Alignment>(*value);

    value = modelRoleDataSpan.dataForRole(Qt::ForegroundRole);
    if (value->canConvert<QBrush>())
        option->palette.setBrush(QPalette::Text, qvariant_cast<QBrush>(*value));

    value = modelRoleDataSpan.dataForRole(Qt::CheckStateRole);
    if (value->isValid() && !value->isNull()) {
        option->features |= QStyleOptionViewItem::HasCheckIndicator;
        option->checkState = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(*value);
    }

    value = modelRoleDataSpan.dataForRole(Qt::DecorationRole);
    if (value->isValid() && !value->isNull()) {
        option->features |= QStyleOptionViewItem::HasDecoration;
        switch (value->userType()) {
        case QMetaType::QIcon: {
            option->icon = qvariant_cast<QIcon>(*value);
            if (option->icon.isNull()) {
                option->features &= ~QStyleOptionViewItem::HasDecoration;
                break;
            }
            QIcon::Mode mode;
            if (!(option->state & QStyle::State_Enabled))
                mode = QIcon::Disabled;
            else if (option->state & QStyle::State_Selected)
                mode = QIcon::Selected;
            else
                mode = QIcon::Normal;
            QIcon::State state = option->state & QStyle::State_Open ? QIcon::On : QIcon::Off;
            QSize actualSize = option->icon.actualSize(option->decorationSize, mode, state);
            // For highdpi icons actualSize might be larger than decorationSize, which we don't want. Clamp it to decorationSize.
            option->decorationSize = QSize(qMin(option->decorationSize.width(), actualSize.width()),
                                           qMin(option->decorationSize.height(), actualSize.height()));
            break;
        }
        case QMetaType::QColor: {
            QPixmap pixmap(option->decorationSize);
            pixmap.fill(qvariant_cast<QColor>(*value));
            option->icon = QIcon(pixmap);
            break;
        }
        case QMetaType::QImage: {
            QImage image = qvariant_cast<QImage>(*value);
            option->icon = QIcon(QPixmap::fromImage(image));
            option->decorationSize = image.deviceIndependentSize().toSize();
            break;
        }
        case QMetaType::QPixmap: {
            QPixmap pixmap = qvariant_cast<QPixmap>(*value);
            option->icon = QIcon(pixmap);
            option->decorationSize = pixmap.deviceIndependentSize().toSize();
            break;
        }
        default:
            break;
        }
    }

    value = modelRoleDataSpan.dataForRole(Qt::DisplayRole);
    if (value->isValid() && !value->isNull()) {
        option->features |= QStyleOptionViewItem::HasDisplay;
        option->text = displayText(*value, option->locale);
    }

    value = modelRoleDataSpan.dataForRole(Qt::BackgroundRole);
    option->backgroundBrush = qvariant_cast<QBrush>(*value);

    // disable style animations for checkboxes etc. within itemviews (QTBUG-30146)
    option->styleObject = nullptr;
}